

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autolink.cc
# Opt level: O3

base_learner * autolink_setup(options_i *options,vw *all)

{
  undefined4 uVar1;
  int iVar2;
  autolink *location;
  base_learner *l;
  single_learner *__src;
  learner<autolink,_example> *__dest;
  uint32_t *puVar3;
  size_type __dnew;
  option_group_definition new_options;
  long local_170;
  option_group_definition local_168;
  long *local_130;
  long local_128;
  long local_120 [2];
  string local_110;
  undefined8 *local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined1 local_d8;
  undefined1 local_d0 [112];
  bool local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  location = calloc_or_throw<autolink>(1);
  location->d = 0;
  location->stride_shift = 0;
  local_e0 = 0x6b6e696c6f747541;
  local_e8 = 8;
  local_d8 = 0;
  local_168.m_name._M_dataplus._M_p = (pointer)&local_168.m_name.field_2;
  local_f0 = &local_e0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_168,&local_e0);
  local_168.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_f0 != &local_e0) {
    operator_delete(local_f0);
  }
  local_110.field_2._M_allocated_capacity = 0x6b6e696c6f747561;
  local_110._M_string_length = 8;
  local_110.field_2._M_local_buf[8] = '\0';
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_d0,&local_110,&location->d);
  local_60 = true;
  local_170 = 0x26;
  local_130 = local_120;
  local_130 = (long *)std::__cxx11::string::_M_create((ulong *)&local_130,(ulong)&local_170);
  local_120[0] = local_170;
  local_130[2] = 0x746977206e6f6974;
  local_130[3] = 0x6f6e796c6f702068;
  *local_130 = 0x6c20657461657263;
  local_130[1] = 0x636e7566206b6e69;
  builtin_strncpy((char *)((long)local_130 + 0x1e),"nomial d",8);
  local_128 = local_170;
  *(char *)((long)local_130 + local_170) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_d0 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
            (&local_168,(typed_option<unsigned_int> *)local_d0);
  if (local_130 != local_120) {
    operator_delete(local_130);
  }
  local_d0._0_8_ = &PTR__typed_option_002da760;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_168);
  local_d0._16_8_ = 0x6b6e696c6f747561;
  local_d0._8_8_ = (pointer)0x8;
  local_d0[0x18] = '\0';
  local_d0._0_8_ = local_d0 + 0x10;
  iVar2 = (*options->_vptr_options_i[1])(options,local_d0);
  if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
    operator_delete((void *)local_d0._0_8_);
  }
  if ((char)iVar2 == '\0') {
    __dest = (learner<autolink,_example> *)0x0;
  }
  else {
    puVar3 = &(all->weights).dense_weights._stride_shift;
    if ((all->weights).sparse != false) {
      puVar3 = &(all->weights).sparse_weights._stride_shift;
    }
    location->stride_shift = *puVar3;
    l = setup_base(options,all);
    __src = LEARNER::as_singleline<char,char>(l);
    uVar1 = *(undefined4 *)(__src + 0xd0);
    __dest = calloc_or_throw<LEARNER::learner<autolink,example>>(1);
    memcpy(__dest,__src,0xe9);
    *(single_learner **)(__dest + 0x20) = __src;
    *(code **)(__dest + 0x50) = LEARNER::recur_sensitivity;
    *(autolink **)(__dest + 0xb8) = location;
    *(single_learner **)(__dest + 0xc0) = __src;
    *(code **)(__dest + 200) = LEARNER::noop;
    *(undefined8 *)(__dest + 0xd8) = 1;
    *(undefined8 *)(__dest + 0xe0) = *(undefined8 *)(__src + 0xe0);
    *(autolink **)(__dest + 0x18) = location;
    *(code **)(__dest + 0x28) = predict_or_learn<true>;
    *(code **)(__dest + 0x38) = predict_or_learn<true>;
    *(code **)(__dest + 0x30) = predict_or_learn<false>;
    *(undefined8 *)(__dest + 0x40) = 0;
    *(undefined4 *)(__dest + 0xd0) = uVar1;
    __dest[0xe8] = (learner<autolink,_example>)0x0;
    location = (autolink *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_168.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168.m_name._M_dataplus._M_p != &local_168.m_name.field_2) {
    operator_delete(local_168.m_name._M_dataplus._M_p);
  }
  if (location != (autolink *)0x0) {
    free(location);
  }
  return (base_learner *)__dest;
}

Assistant:

LEARNER::base_learner* autolink_setup(options_i& options, vw& all)
{
  free_ptr<autolink> data = scoped_calloc_or_throw<autolink>();
  option_group_definition new_options("Autolink");
  new_options.add(make_option("autolink", data->d).keep().help("create link function with polynomial d"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("autolink"))
    return nullptr;

  data->stride_shift = all.weights.stride_shift();

  LEARNER::learner<autolink, example>& ret =
      init_learner(data, as_singleline(setup_base(options, all)), predict_or_learn<true>, predict_or_learn<false>);

  return make_base(ret);
}